

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
external_light_sensor_message_write_read::test_method
          (external_light_sensor_message_write_read *this)

{
  size_t i;
  long lVar1;
  external_light_sensor_message write_msg;
  buffer buffer;
  buffer_writer writer;
  external_light_sensor_message read_msg;
  buffer_reader reader;
  double local_e0;
  buffer local_d8;
  buffer_writer local_b8;
  assertion_result local_a8;
  external_light_sensor_message local_90;
  buffer_reader local_88;
  const_string local_70;
  char *local_60;
  char *local_58;
  lazy_ostream local_50;
  undefined1 *local_40;
  char **local_38;
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  local_30;
  
  local_e0 = 0.6;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer_writer::buffer_writer(&local_b8,&local_d8);
  local_50._vptr_lazy_ostream =
       (_func_int **)CONCAT35(local_50._vptr_lazy_ostream._5_3_,0x4100000000);
  local_50._vptr_lazy_ostream = (_func_int **)CONCAT44(local_50._vptr_lazy_ostream._4_4_,0xd);
  ::operator<<(&local_b8,(message_header *)&local_50);
  lVar1 = 0;
  do {
    buffer_writer::operator<<(&local_b8,*(uint8_t *)((long)&local_e0 + lVar1));
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  buffer_reader::buffer_reader(&local_88,&local_d8);
  ::operator>>(&local_88,&local_90);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b2d70,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x184984);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 200;
  local_30.m_rhs = &local_e0;
  local_30.m_lhs.m_value = (double *)&local_90;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  ::evaluate(&local_a8,&local_30,false);
  local_38 = &local_60;
  local_60 = "read_msg.data[i] == write_msg.data[i]";
  local_58 = "";
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ae7e8;
  local_40 = boost::unit_test::lazy_ostream::inst;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_70.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_50,&local_70,200,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(external_light_sensor_message_write_read)
{
    external_light_sensor_message write_msg;
    for(int i = 0; i<1; i++){
      write_msg.data[i] = static_cast<double>(i) + 0.6;
    }

    buffer buffer;
    buffer_writer writer(buffer);
    writer << write_msg;

    external_light_sensor_message read_msg;
    buffer_reader reader(buffer);
    reader >> read_msg;

    for(int i = 0; i<1; i++){
      BOOST_TEST(read_msg.data[i] == write_msg.data[i]);
    }
}